

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

void __thiscall
icu_63::CollationRuleParser::parseRelationStrings
          (CollationRuleParser *this,int32_t strength,int32_t i,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *pUVar2;
  char16_t cVar3;
  int32_t offset;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  UnicodeString prefix;
  UnicodeString str;
  UnicodeString extension;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  offset = parseTailoringString(this,i,&local_b0,errorCode);
  if (U_ZERO_ERROR < *errorCode) goto LAB_00242f5d;
  pUVar2 = this->rules;
  sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (pUVar2->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (offset < iVar4) {
    cVar3 = UnicodeString::doCharAt(pUVar2,offset);
    if (cVar3 == L'|') {
      UnicodeString::operator=(&local_f0,&local_b0);
      offset = parseTailoringString(this,offset + 1,&local_b0,errorCode);
      if (U_ZERO_ERROR < *errorCode) goto LAB_00242f5d;
      pUVar2 = this->rules;
      sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar4 = (pUVar2->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar1 >> 5;
      }
      if (iVar4 <= offset) goto LAB_00242ec6;
      cVar3 = UnicodeString::doCharAt(pUVar2,offset);
    }
    if (cVar3 == L'/') {
      offset = parseTailoringString(this,offset + 1,&local_70,errorCode);
    }
  }
LAB_00242ec6:
  if ((ushort)local_f0.fUnion.fStackFields.fLengthAndFlags < 0x20) {
LAB_00242f0e:
    (*(this->sink->super_UObject)._vptr_UObject[4])
              (this->sink,strength,&local_f0,&local_b0,&local_70,&this->errorReason,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      setErrorContext(this);
    }
    this->ruleIndex = offset;
  }
  else {
    uVar5 = UnicodeString::char32At(&local_f0,0);
    uVar6 = UnicodeString::char32At(&local_b0,0);
    iVar7 = (*(this->nfc->super_UObject)._vptr_UObject[0xf])(this->nfc,(ulong)uVar5);
    if ((char)iVar7 != '\0') {
      iVar7 = (*(this->nfc->super_UObject)._vptr_UObject[0xf])(this->nfc,(ulong)uVar6);
      if ((char)iVar7 != '\0') goto LAB_00242f0e;
    }
    setParseError(this,"in \'prefix|str\', prefix and str must each start with an NFC boundary",
                  errorCode);
  }
LAB_00242f5d:
  UnicodeString::~UnicodeString(&local_70);
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_f0);
  return;
}

Assistant:

void
CollationRuleParser::parseRelationStrings(int32_t strength, int32_t i, UErrorCode &errorCode) {
    // Parse
    //     prefix | str / extension
    // where prefix and extension are optional.
    UnicodeString prefix, str, extension;
    i = parseTailoringString(i, str, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    UChar next = (i < rules->length()) ? rules->charAt(i) : 0;
    if(next == 0x7c) {  // '|' separates the context prefix from the string.
        prefix = str;
        i = parseTailoringString(i + 1, str, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        next = (i < rules->length()) ? rules->charAt(i) : 0;
    }
    if(next == 0x2f) {  // '/' separates the string from the extension.
        i = parseTailoringString(i + 1, extension, errorCode);
    }
    if(!prefix.isEmpty()) {
        UChar32 prefix0 = prefix.char32At(0);
        UChar32 c = str.char32At(0);
        if(!nfc.hasBoundaryBefore(prefix0) || !nfc.hasBoundaryBefore(c)) {
            setParseError("in 'prefix|str', prefix and str must each start with an NFC boundary",
                          errorCode);
            return;
        }
    }
    sink->addRelation(strength, prefix, str, extension, errorReason, errorCode);
    if(U_FAILURE(errorCode)) { setErrorContext(); }
    ruleIndex = i;
}